

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QtPrivate::QColorLuminancePicker::setCol(QColorLuminancePicker *this,int h,int s)

{
  long in_FS_OFFSET;
  int local_54;
  int local_50;
  int local_4c;
  void *local_48;
  int *piStack_40;
  int *local_38;
  int *piStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this->hue = h;
  this->sat = s;
  if (this->pix != (QPixmap *)0x0) {
    (**(code **)(*(long *)this->pix + 8))();
  }
  this->pix = (QPixmap *)0x0;
  QWidget::repaint(&this->super_QWidget);
  local_54 = this->val;
  piStack_40 = &local_4c;
  local_38 = &local_50;
  piStack_30 = &local_54;
  local_48 = (void *)0x0;
  local_50 = s;
  local_4c = h;
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorLuminancePicker::setCol(int h, int s)
{
    setCol(h, s, val);
    emit newHsv(h, s, val);
}